

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_union_ref_t * flatcc_builder_extend_union_vector(flatcc_builder_t *B,size_t count)

{
  int iVar1;
  flatcc_builder_union_ref_t *pfVar2;
  
  iVar1 = vector_count_add(B,(flatbuffers_uoffset_t)count,0x1fffffff);
  if (iVar1 != 0) {
    return (flatcc_builder_union_ref_t *)0x0;
  }
  pfVar2 = (flatcc_builder_union_ref_t *)push_ds(B,(flatbuffers_uoffset_t)count << 3);
  return pfVar2;
}

Assistant:

flatcc_builder_union_ref_t *flatcc_builder_extend_union_vector(flatcc_builder_t *B, size_t count)
{
    if (vector_count_add(B, (uoffset_t)count, max_union_count)) {
        return 0;
    }
    return push_ds(B, (uoffset_t)(union_size * count));
}